

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O1

bool __thiscall lunasvg::decodeText(lunasvg *this,string_view input,string *output)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  int base;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  lunasvg *plVar11;
  char c [5];
  uint local_48;
  
  pcVar6 = input._M_str;
  pcVar6[8] = '\0';
  pcVar6[9] = '\0';
  pcVar6[10] = '\0';
  pcVar6[0xb] = '\0';
  pcVar6[0xc] = '\0';
  pcVar6[0xd] = '\0';
  pcVar6[0xe] = '\0';
  pcVar6[0xf] = '\0';
  **(undefined1 **)pcVar6 = 0;
  piVar8 = (int *)input._M_len;
  do {
    plVar11 = this;
    if (plVar11 == (lunasvg *)0x0) break;
    piVar9 = (int *)((long)piVar8 + 1);
    this = plVar11 + -1;
    if ((char)*piVar8 == '&') {
      if ((this == (lunasvg *)0x0) || (*(char *)piVar9 != '#')) {
        bVar1 = false;
      }
      else {
        piVar9 = (int *)((long)piVar8 + 2);
        this = plVar11 + -2;
        bVar1 = true;
      }
      if (bVar1) {
        uVar7 = 10;
        if ((this != (lunasvg *)0x0) && ((char)*piVar9 == 'x')) {
          piVar9 = (int *)((long)piVar9 + 1);
          this = this + -1;
          uVar7 = 0x10;
        }
        uVar3 = (uint)(0xffffffff / uVar7);
        if ((this != (lunasvg *)0x0) && ((char)*piVar9 == '+')) {
          piVar9 = (int *)((long)piVar9 + 1);
          this = this + -1;
        }
        uVar4 = local_48;
        if (this == (lunasvg *)0x0) {
          bVar1 = false;
        }
        else {
          base = (int)uVar7;
          bVar2 = isIntegralDigit((char)*piVar9,base);
          bVar1 = false;
          if (bVar2) {
            uVar10 = 0;
            do {
              iVar5 = (int)(char)*piVar9;
              uVar4 = iVar5 - 0x30;
              if (9 < uVar4) {
                if ((char)*piVar9 < 'a') {
                  uVar4 = iVar5 - 0x37;
                }
                else {
                  uVar4 = iVar5 - 0x57;
                }
              }
              if ((uVar3 < uVar10) || ((uVar10 == uVar3 && ((uint)(0xffffffff % uVar7) < uVar4)))) {
                bVar1 = false;
              }
              else {
                uVar10 = uVar10 * base + uVar4;
                piVar9 = (int *)((long)piVar9 + 1);
                this = this + -1;
                bVar1 = true;
              }
              uVar4 = local_48;
            } while (((bVar1) && (uVar4 = uVar10, this != (lunasvg *)0x0)) &&
                    (bVar2 = isIntegralDigit((char)*piVar9,base), bVar2));
          }
        }
        bVar2 = true;
        local_48 = uVar4;
        if (bVar1) {
          if (0x7f < uVar4) {
            if (uVar4 < 0x800) {
              uVar4 = uVar4 >> 6;
            }
            else if (uVar4 < 0x10000) {
              uVar4 = uVar4 >> 0xc;
            }
            else if (uVar4 < 0x200000) {
              uVar4 = uVar4 >> 0x12;
            }
          }
          std::__cxx11::string::append(pcVar6);
          local_48 = uVar4;
          if (bVar1) goto LAB_0011c59d;
        }
      }
      else {
        if ((this < (lunasvg *)0x3) ||
           (*(char *)((long)piVar9 + 2) != 'p' || (short)*piVar9 != 0x6d61)) {
          bVar1 = false;
        }
        else {
          piVar9 = (int *)((long)piVar9 + 3);
          this = this + -3;
          bVar1 = true;
        }
        if (!bVar1) {
          if ((this < (lunasvg *)0x2) || ((short)*piVar9 != 0x746c)) {
            bVar1 = false;
          }
          else {
            piVar9 = (int *)((long)piVar9 + 2);
            this = this + -2;
            bVar1 = true;
          }
          if (!bVar1) {
            if ((this < (lunasvg *)0x2) || ((short)*piVar9 != 0x7467)) {
              bVar1 = false;
            }
            else {
              piVar9 = (int *)((long)piVar9 + 2);
              this = this + -2;
              bVar1 = true;
            }
            if (!bVar1) {
              if ((this < (lunasvg *)0x4) || (*piVar9 != 0x746f7571)) {
                bVar1 = false;
              }
              else {
                piVar9 = piVar9 + 1;
                this = this + -4;
                bVar1 = true;
              }
              if (!bVar1) {
                if ((this < (lunasvg *)0x4) || (*piVar9 != 0x736f7061)) {
                  bVar1 = false;
                }
                else {
                  piVar9 = piVar9 + 1;
                  this = this + -4;
                  bVar1 = true;
                }
                bVar2 = true;
                if (!bVar1) goto LAB_0011c2fd;
              }
            }
          }
        }
        std::__cxx11::string::push_back((char)input._M_str);
LAB_0011c59d:
        bVar2 = true;
        if ((this != (lunasvg *)0x0) && ((char)*piVar9 == ';')) {
          piVar9 = (int *)((long)piVar9 + 1);
          this = this + -1;
          goto LAB_0011c2fb;
        }
      }
    }
    else {
      std::__cxx11::string::push_back((char)input._M_str);
LAB_0011c2fb:
      bVar2 = false;
    }
LAB_0011c2fd:
    piVar8 = piVar9;
  } while (!bVar2);
  return plVar11 == (lunasvg *)0x0;
}

Assistant:

inline bool decodeText(std::string_view input, std::string& output)
{
    output.clear();
    while(!input.empty()) {
        auto ch = input.front();
        input.remove_prefix(1);
        if(ch != '&') {
            output.push_back(ch);
            continue;
        }

        if(skipDelimiter(input, '#')) {
            int base = 10;
            if(skipDelimiter(input, 'x'))
                base = 16;
            unsigned int cp;
            if(!parseInteger(input, cp, base))
                return false;
            char c[5] = {0, 0, 0, 0, 0};
            if(cp < 0x80) {
                c[1] = 0;
                c[0] = char(cp);
            } else if(cp < 0x800) {
                c[2] = 0;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xC0);
            } else if(cp < 0x10000) {
                c[3] = 0;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xE0);
            } else if(cp < 0x200000) {
                c[4] = 0;
                c[3] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[2] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[1] = char((cp & 0x3F) | 0x80);
                cp >>= 6;
                c[0] = char(cp | 0xF0);
            }

            output.append(c);
        } else {
            if(skipString(input, "amp")) {
                output.push_back('&');
            } else if(skipString(input, "lt")) {
                output.push_back('<');
            } else if(skipString(input, "gt")) {
                output.push_back('>');
            } else if(skipString(input, "quot")) {
                output.push_back('\"');
            } else if(skipString(input, "apos")) {
                output.push_back('\'');
            } else {
                return false;
            }
        }

        if(!skipDelimiter(input, ';')) {
            return false;
        }
    }

    return true;
}